

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve_copy_sse2.c
# Opt level: O0

void highbd_copy_64(uint16_t *src,uint16_t *dst)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  __m256i s [4];
  
  uVar1 = in_RDI[1];
  uVar2 = in_RDI[2];
  uVar3 = in_RDI[3];
  uVar4 = in_RDI[4];
  uVar5 = in_RDI[5];
  uVar6 = in_RDI[6];
  uVar7 = in_RDI[7];
  uVar8 = in_RDI[8];
  uVar9 = in_RDI[9];
  uVar10 = in_RDI[10];
  uVar11 = in_RDI[0xb];
  uVar12 = in_RDI[0xc];
  uVar13 = in_RDI[0xd];
  uVar14 = in_RDI[0xe];
  uVar15 = in_RDI[0xf];
  *in_RSI = *in_RDI;
  in_RSI[1] = uVar1;
  in_RSI[2] = uVar2;
  in_RSI[3] = uVar3;
  in_RSI[4] = uVar4;
  in_RSI[5] = uVar5;
  in_RSI[6] = uVar6;
  in_RSI[7] = uVar7;
  in_RSI[8] = uVar8;
  in_RSI[9] = uVar9;
  in_RSI[10] = uVar10;
  in_RSI[0xb] = uVar11;
  in_RSI[0xc] = uVar12;
  in_RSI[0xd] = uVar13;
  in_RSI[0xe] = uVar14;
  in_RSI[0xf] = uVar15;
  return;
}

Assistant:

static inline void highbd_copy_64(const uint16_t *src, uint16_t *dst) {
  __m128i s[8];
  s[0] = _mm_loadu_si128((__m128i *)(src + 0 * 8));
  s[1] = _mm_loadu_si128((__m128i *)(src + 1 * 8));
  s[2] = _mm_loadu_si128((__m128i *)(src + 2 * 8));
  s[3] = _mm_loadu_si128((__m128i *)(src + 3 * 8));
  s[4] = _mm_loadu_si128((__m128i *)(src + 4 * 8));
  s[5] = _mm_loadu_si128((__m128i *)(src + 5 * 8));
  s[6] = _mm_loadu_si128((__m128i *)(src + 6 * 8));
  s[7] = _mm_loadu_si128((__m128i *)(src + 7 * 8));
  _mm_store_si128((__m128i *)(dst + 0 * 8), s[0]);
  _mm_store_si128((__m128i *)(dst + 1 * 8), s[1]);
  _mm_store_si128((__m128i *)(dst + 2 * 8), s[2]);
  _mm_store_si128((__m128i *)(dst + 3 * 8), s[3]);
  _mm_store_si128((__m128i *)(dst + 4 * 8), s[4]);
  _mm_store_si128((__m128i *)(dst + 5 * 8), s[5]);
  _mm_store_si128((__m128i *)(dst + 6 * 8), s[6]);
  _mm_store_si128((__m128i *)(dst + 7 * 8), s[7]);
}